

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O0

void delete_from_fdwsi(lws_context *context,lws *wsi)

{
  lws **pplVar1;
  bool bVar2;
  lws **done;
  lws **p;
  lws *wsi_local;
  lws_context *context_local;
  
  if ((*(ushort *)&context->field_0x7b7 >> 10 & 1) != 0) {
    done = context->lws_lookup;
    pplVar1 = done + context->max_fds;
    while( true ) {
      bVar2 = false;
      if ((done != pplVar1) && (bVar2 = true, *done != (lws *)0x0)) {
        bVar2 = *done != wsi;
      }
      if (!bVar2) break;
      done = done + 1;
    }
    if (done != pplVar1) {
      *done = (lws *)0x0;
    }
  }
  return;
}

Assistant:

void
delete_from_fdwsi(const struct lws_context *context, struct lws *wsi)
{

	struct lws **p, **done;

	if (!context->max_fds_unrelated_to_ulimit)
		return;


	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	/* find the match */

	while (p != done && (!*p || (*p) != wsi))
		p++;

	if (p != done)
		*p = NULL;
}